

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_4,_4>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_4,_4>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *dst)

{
  float *pfVar1;
  Vector<float,_4> *pVVar2;
  int row_1;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> scalars;
  Value mat;
  vector<float,_std::allocator<float>_> local_78;
  value_type local_58;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_78);
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    do {
      local_58.m_data.m_data[3].m_data[0] = 0.0;
      local_58.m_data.m_data[3].m_data[1] = 0.0;
      local_58.m_data.m_data[3].m_data[2] = 0.0;
      local_58.m_data.m_data[3].m_data[3] = 0.0;
      local_58.m_data.m_data[2].m_data[0] = 0.0;
      local_58.m_data.m_data[2].m_data[1] = 0.0;
      local_58.m_data.m_data[2].m_data[2] = 0.0;
      local_58.m_data.m_data[2].m_data[3] = 0.0;
      local_58.m_data.m_data[1].m_data[0] = 0.0;
      local_58.m_data.m_data[1].m_data[1] = 0.0;
      local_58.m_data.m_data[1].m_data[2] = 0.0;
      local_58.m_data.m_data[1].m_data[3] = 0.0;
      local_58.m_data.m_data[0].m_data[0] = 0.0;
      local_58.m_data.m_data[0].m_data[1] = 0.0;
      local_58.m_data.m_data[0].m_data[2] = 0.0;
      local_58.m_data.m_data[0].m_data[3] = 0.0;
      lVar3 = 0;
      lVar4 = 0;
      pfVar1 = (float *)&local_58;
      do {
        lVar5 = 0;
        do {
          if (lVar3 == lVar5) {
            fVar7 = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
          }
          else {
            fVar7 = 0.0;
          }
          *(float *)((long)pfVar1 + lVar5) = fVar7;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x40);
        lVar4 = lVar4 + 1;
        pfVar1 = pfVar1 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar4 != 4);
      std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
      emplace_back<tcu::Matrix<float,4,4>>
                ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)dst,
                 &local_58);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  pfVar1 = (float *)&local_58;
  local_58.m_data.m_data[3].m_data[0] = 0.0;
  local_58.m_data.m_data[3].m_data[1] = 0.0;
  local_58.m_data.m_data[3].m_data[2] = 0.0;
  local_58.m_data.m_data[3].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[3] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[3] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[0].m_data[3] = 0.0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = 0;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 4);
  pVVar2 = local_58.m_data.m_data + 3;
  local_58.m_data.m_data[0].m_data[0] = 1.0;
  fVar7 = 1.0;
  lVar3 = 0;
  do {
    pVVar2->m_data[0] = fVar7;
    fVar7 = fVar7 + fVar7;
    lVar3 = lVar3 + 1;
    pVVar2 = (Vector<float,_4> *)(pVVar2[-1].m_data + 1);
  } while (lVar3 != 4);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            (dst,&local_58);
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}